

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::getScalarAlignment(TType *type,int *size,int *stride,bool rowMajor)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined4 extraout_var;
  int *piVar7;
  byte local_1a9;
  undefined1 local_190 [8];
  TType derefType_1;
  int scalarAlign;
  int memberAlignment;
  TLayoutMatrix subMatrixLayout;
  int memberSize;
  size_t m;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvStack_d8;
  int maxAlignment;
  TTypeList *memberList;
  TType derefType;
  int dummyStride;
  int alignment;
  bool rowMajor_local;
  int *stride_local;
  int *size_local;
  TType *type_local;
  
  *stride = 0;
  uVar2 = (*type->_vptr_TType[0x1d])();
  if ((uVar2 & 1) == 0) {
    iVar3 = (*type->_vptr_TType[7])();
    if (iVar3 == 0xf) {
      pvStack_d8 = &TType::getStruct(type)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      *size = 0;
      m._4_4_ = 0;
      for (_subMatrixLayout = 0; uVar1 = _subMatrixLayout,
          sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (pvStack_d8), uVar1 < sVar5; _subMatrixLayout = _subMatrixLayout + 1) {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](pvStack_d8,_subMatrixLayout);
        iVar3 = (*pvVar6->type->_vptr_TType[10])();
        uVar2 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8) >> 0x3d);
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](pvStack_d8,_subMatrixLayout);
        local_1a9 = rowMajor;
        if (uVar2 != 0) {
          local_1a9 = uVar2 == 1;
        }
        derefType_1.spirvType._4_4_ =
             getScalarAlignment(pvVar6->type,&memberAlignment,
                                (int *)((long)&derefType.spirvType + 4),(bool)(local_1a9 & 1));
        piVar7 = std::max<int>((int *)((long)&m + 4),(int *)((long)&derefType_1.spirvType + 4));
        m._4_4_ = *piVar7;
        RoundToPow2<int>(size,derefType_1.spirvType._4_4_);
        *size = memberAlignment + *size;
      }
      type_local._4_4_ = m._4_4_;
    }
    else {
      uVar2 = (*type->_vptr_TType[0x18])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*type->_vptr_TType[0x1b])();
        if ((uVar2 & 1) == 0) {
          uVar2 = (*type->_vptr_TType[0x1c])();
          if ((uVar2 & 1) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                          ,0x97d,
                          "static int glslang::TIntermediate::getScalarAlignment(const TType &, int &, int &, bool)"
                         );
          }
          TType::TType((TType *)local_190,type,0,rowMajor);
          type_local._4_4_ =
               getScalarAlignment((TType *)local_190,size,(int *)((long)&derefType.spirvType + 4),
                                  rowMajor);
          *stride = *size;
          if (rowMajor) {
            iVar3 = *stride;
            iVar4 = (*type->_vptr_TType[0xe])();
            *size = iVar3 * iVar4;
          }
          else {
            iVar3 = *stride;
            iVar4 = (*type->_vptr_TType[0xd])();
            *size = iVar3 * iVar4;
          }
          TType::~TType((TType *)local_190);
        }
        else {
          derefType_1.spirvType._0_4_ = getBaseAlignmentScalar(type,size);
          iVar3 = (*type->_vptr_TType[0xc])();
          *size = iVar3 * *size;
          type_local._4_4_ = (int)derefType_1.spirvType;
        }
      }
      else {
        type_local._4_4_ = getBaseAlignmentScalar(type,size);
      }
    }
  }
  else {
    TType::TType((TType *)&memberList,type,0,false);
    type_local._4_4_ =
         getScalarAlignment((TType *)&memberList,size,(int *)((long)&derefType.spirvType + 4),
                            rowMajor);
    *stride = *size;
    RoundToPow2<int>(stride,type_local._4_4_);
    iVar3 = *stride;
    iVar4 = (*type->_vptr_TType[0xf])();
    *size = iVar3 * (iVar4 + -1) + *size;
    TType::~TType((TType *)&memberList);
  }
  return type_local._4_4_;
}

Assistant:

int TIntermediate::getScalarAlignment(const TType& type, int& size, int& stride, bool rowMajor)
{
    int alignment;

    stride = 0;
    int dummyStride;

    if (type.isArray()) {
        TType derefType(type, 0);
        alignment = getScalarAlignment(derefType, size, dummyStride, rowMajor);

        stride = size;
        RoundToPow2(stride, alignment);

        size = stride * (type.getOuterArraySize() - 1) + size;
        return alignment;
    }

    if (type.getBasicType() == EbtStruct) {
        const TTypeList& memberList = *type.getStruct();

        size = 0;
        int maxAlignment = 0;
        for (size_t m = 0; m < memberList.size(); ++m) {
            int memberSize;
            // modify just the children's view of matrix layout, if there is one for this member
            TLayoutMatrix subMatrixLayout = memberList[m].type->getQualifier().layoutMatrix;
            int memberAlignment = getScalarAlignment(*memberList[m].type, memberSize, dummyStride,
                                                     (subMatrixLayout != ElmNone) ? (subMatrixLayout == ElmRowMajor) : rowMajor);
            maxAlignment = std::max(maxAlignment, memberAlignment);
            RoundToPow2(size, memberAlignment);
            size += memberSize;
        }

        return maxAlignment;
    }

    if (type.isScalar())
        return getBaseAlignmentScalar(type, size);

    if (type.isVector()) {
        int scalarAlign = getBaseAlignmentScalar(type, size);

        size *= type.getVectorSize();
        return scalarAlign;
    }

    if (type.isMatrix()) {
        TType derefType(type, 0, rowMajor);

        alignment = getScalarAlignment(derefType, size, dummyStride, rowMajor);

        stride = size;  // use intra-matrix stride for stride of a just a matrix
        if (rowMajor)
            size = stride * type.getMatrixRows();
        else
            size = stride * type.getMatrixCols();

        return alignment;
    }

    assert(0);  // all cases should be covered above
    size = 1;
    return 1;
}